

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scv.c
# Opt level: O3

scv_vector * scv_new(size_t objsize,size_t capacity)

{
  undefined1 auVar1 [16];
  scv_vector *__ptr;
  void *pvVar2;
  size_t __size;
  ulong uVar3;
  
  uVar3 = capacity + (capacity == 0);
  if (objsize != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = objsize;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) <= uVar3) {
      return (scv_vector *)0x0;
    }
    __ptr = (scv_vector *)malloc(0x20);
    if (__ptr != (scv_vector *)0x0) {
      __size = uVar3 * objsize;
      if (__size < 0x40) {
        uVar3 = (objsize + 0x3f) / objsize;
        __size = uVar3 * objsize;
      }
      pvVar2 = malloc(__size);
      __ptr->data = pvVar2;
      if (pvVar2 != (void *)0x0) {
        __ptr->objsize = objsize;
        __ptr->size = 0;
        __ptr->capacity = uVar3;
        return __ptr;
      }
      free(__ptr);
    }
  }
  return (scv_vector *)0x0;
}

Assistant:

struct scv_vector *scv_new(size_t objsize, size_t capacity)
{
	struct scv_vector *v;

	if (capacity == 0) {
		capacity = 1;
	}

	if (objsize == 0 || capacity >= (size_t) -1 / objsize) {
		return NULL;
	}

	v = (struct scv_vector *) malloc(sizeof *v);

	if (v == NULL) {
		return NULL;
	}

	/* Minimum capacity is SCV_MIN_ALLOC bytes or 1 element */
	if (capacity * objsize < SCV_MIN_ALLOC) {
		capacity = (SCV_MIN_ALLOC + (objsize - 1)) / objsize;
	}

	v->data = malloc(capacity * objsize);

	if (v->data == NULL) {
		free(v);
		return NULL;
	}

	v->objsize = objsize;
	v->size = 0;
	v->capacity = capacity;

	return v;
}